

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scale_x86_avx.cpp
# Opt level: O0

int __thiscall
ncnn::Scale_x86_avx::forward_inplace
          (Scale_x86_avx *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_top_blobs,
          Option *opt)

{
  float fVar1;
  float fVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  void *pvVar8;
  long lVar9;
  void *pvVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  undefined1 auVar17 [24];
  int iVar18;
  int iVar19;
  reference pvVar20;
  reference pvVar21;
  undefined8 *puVar22;
  undefined8 *puVar23;
  undefined8 *puVar24;
  undefined8 *puVar25;
  undefined1 (*pauVar26) [24];
  int iVar27;
  int iVar28;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *in_RSI;
  long in_RDI;
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  __m128 _p128_5;
  __m256 _p256_5;
  int i_8;
  __m128 _p128_4;
  __m256 _p256_4;
  int i_7;
  __m256 _b256_1;
  __m128 _b128_1;
  float b_1;
  __m256 _s256_3;
  __m128 _s128_3;
  float s_1;
  float *ptr_2;
  int q;
  int size_2;
  __m128 _p128_3;
  __m256 _p256_3;
  int j_1;
  __m128 _p128_2;
  __m256 _p256_2;
  int j;
  __m256 _b256;
  __m128 _b128;
  float b;
  __m256 _s256_2;
  __m128 _s128_2;
  float s;
  float *ptr_1;
  int i_6;
  int size_1;
  int i_5;
  __m128 _s128_1;
  __m128 _p128_1;
  int i_4;
  int ii_3;
  __m256 _s256_1;
  __m256 _p256_1;
  int i_3;
  int ii_2;
  int remain_size_start_1;
  int nn_size_1;
  int i_2;
  __m128 _bias128;
  __m128 _s128;
  __m128 _p128;
  int i_1;
  int ii_1;
  __m256 _bias256;
  __m256 _s256;
  __m256 _p256;
  int i;
  int ii;
  int remain_size_start;
  int nn_size;
  int size;
  float *ptr;
  float *bias;
  float *scale;
  int elempack;
  int dims;
  int channels;
  int d;
  int h;
  int w;
  Mat *scale_blob;
  Mat *bottom_top_blob;
  Mat *m;
  undefined1 local_e40 [32];
  undefined8 local_e10;
  undefined8 uStack_e08;
  undefined1 local_e00 [28];
  undefined8 local_de0;
  undefined8 uStack_dd8;
  undefined1 local_da0 [32];
  undefined8 local_d70;
  undefined8 uStack_d68;
  undefined1 local_d60 [28];
  undefined8 local_d30;
  undefined8 uStack_d28;
  int local_cd4;
  float local_cc0;
  float fStack_cbc;
  float fStack_cb8;
  float fStack_cb4;
  float fStack_cb0;
  float fStack_cac;
  float fStack_ca8;
  float fStack_ca4;
  int local_c84;
  undefined1 (*local_ba0) [24];
  int local_b98;
  int local_b54;
  float local_b40;
  float fStack_b3c;
  float fStack_b38;
  float fStack_b34;
  float fStack_b30;
  float fStack_b2c;
  float fStack_b28;
  float fStack_b24;
  int local_b04;
  undefined1 (*local_a88) [24];
  int local_a7c;
  int local_a74;
  int local_a44;
  int local_9f0;
  int local_9e4;
  int local_9a4;
  float local_960;
  float fStack_95c;
  float fStack_958;
  float fStack_954;
  float fStack_950;
  float fStack_94c;
  float fStack_948;
  float fStack_944;
  int local_930;
  float local_5a0;
  float fStack_59c;
  float fStack_598;
  float fStack_594;
  float fStack_590;
  float fStack_58c;
  float fStack_588;
  float local_4e0;
  float fStack_4dc;
  float fStack_4d8;
  float fStack_4d4;
  float fStack_4d0;
  float fStack_4cc;
  float fStack_4c8;
  float local_4c0;
  float fStack_4bc;
  float fStack_4b8;
  float fStack_4b4;
  float fStack_4b0;
  float fStack_4ac;
  float fStack_4a8;
  undefined4 uStack_4a4;
  float local_4a0;
  float fStack_49c;
  float fStack_498;
  float fStack_494;
  float fStack_490;
  float fStack_48c;
  float fStack_488;
  float local_480;
  float fStack_47c;
  float fStack_478;
  float fStack_474;
  float fStack_470;
  float fStack_46c;
  float fStack_468;
  undefined4 uStack_464;
  float local_460;
  float fStack_45c;
  float fStack_458;
  float fStack_454;
  float fStack_450;
  float fStack_44c;
  float fStack_448;
  float local_440;
  float fStack_43c;
  float fStack_438;
  float fStack_434;
  float fStack_430;
  float fStack_42c;
  float fStack_428;
  undefined4 uStack_424;
  float local_420;
  float fStack_41c;
  float fStack_418;
  float fStack_414;
  float local_410;
  float fStack_40c;
  float fStack_408;
  float fStack_404;
  float local_3f0;
  float fStack_3ec;
  float fStack_3e8;
  float fStack_3e4;
  float local_3d0;
  float fStack_3cc;
  float fStack_3c8;
  float fStack_3c4;
  float local_3c0;
  float fStack_3bc;
  float fStack_3b8;
  float fStack_3b4;
  float local_3b0;
  float fStack_3ac;
  float fStack_3a8;
  float fStack_3a4;
  float local_3a0;
  float fStack_39c;
  float fStack_398;
  float fStack_394;
  float local_390;
  float fStack_38c;
  float fStack_388;
  float fStack_384;
  float local_380;
  float fStack_37c;
  float fStack_378;
  float fStack_374;
  float local_370;
  float fStack_36c;
  float fStack_368;
  float fStack_364;
  float local_1e0;
  float fStack_1dc;
  float fStack_1d8;
  float fStack_1d4;
  float fStack_1d0;
  float fStack_1cc;
  float fStack_1c8;
  float fStack_1c4;
  float local_1a0;
  float fStack_19c;
  float fStack_198;
  float fStack_194;
  float fStack_190;
  float fStack_18c;
  float fStack_188;
  float fStack_184;
  float local_160;
  float fStack_15c;
  float fStack_158;
  float fStack_154;
  float fStack_150;
  float fStack_14c;
  float fStack_148;
  float fStack_144;
  float local_120;
  float fStack_11c;
  float fStack_118;
  float fStack_114;
  float local_100;
  float fStack_fc;
  float fStack_f8;
  float fStack_f4;
  float local_e0;
  float fStack_dc;
  float fStack_d8;
  float fStack_d4;
  
  pvVar20 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](in_RSI,0);
  pvVar21 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](in_RSI,1);
  iVar19 = pvVar20->w;
  iVar3 = pvVar20->h;
  iVar4 = pvVar20->d;
  iVar5 = pvVar20->c;
  iVar6 = pvVar20->dims;
  iVar7 = pvVar20->elempack;
  pvVar8 = pvVar21->data;
  lVar9 = *(long *)(in_RDI + 0x120);
  if (iVar6 == 1) {
    pvVar10 = pvVar20->data;
    iVar27 = iVar19 * iVar7;
    if (*(int *)(in_RDI + 0xd4) == 0) {
      for (local_9f0 = 0; local_9f0 < iVar27 / 8; local_9f0 = local_9f0 + 1) {
        iVar28 = local_9f0 * 8;
        pauVar26 = (undefined1 (*) [24])((long)pvVar10 + (long)iVar28 * 4);
        auVar17 = *pauVar26;
        uVar11 = *(undefined8 *)pauVar26[1];
        puVar22 = (undefined8 *)((long)pvVar8 + (long)iVar28 * 4);
        puVar23 = (undefined8 *)((long)pvVar10 + (long)iVar28 * 4);
        local_440 = auVar17._0_4_;
        fStack_43c = auVar17._4_4_;
        fStack_438 = auVar17._8_4_;
        fStack_434 = auVar17._12_4_;
        fStack_430 = auVar17._16_4_;
        fStack_42c = auVar17._20_4_;
        fStack_428 = (float)uVar11;
        uStack_424 = (undefined4)((ulong)uVar11 >> 0x20);
        local_460 = (float)*puVar22;
        fStack_45c = (float)((ulong)*puVar22 >> 0x20);
        fStack_458 = (float)puVar22[1];
        fStack_454 = (float)((ulong)puVar22[1] >> 0x20);
        fStack_450 = (float)puVar22[2];
        fStack_44c = (float)((ulong)puVar22[2] >> 0x20);
        fStack_448 = (float)puVar22[3];
        *puVar23 = CONCAT44(fStack_43c * fStack_45c,local_440 * local_460);
        puVar23[1] = CONCAT44(fStack_434 * fStack_454,fStack_438 * fStack_458);
        puVar23[2] = CONCAT44(fStack_42c * fStack_44c,fStack_430 * fStack_450);
        puVar23[3] = CONCAT44(uStack_424,fStack_428 * fStack_448);
      }
      local_a74 = (iVar27 / 8) * 8;
      iVar28 = (iVar27 % 8) / 4;
      for (local_a44 = 0; local_a44 < iVar28; local_a44 = local_a44 + 1) {
        iVar18 = local_a74 + local_a44 * 4;
        puVar22 = (undefined8 *)((long)pvVar10 + (long)iVar18 * 4);
        uVar11 = *puVar22;
        uVar12 = puVar22[1];
        puVar22 = (undefined8 *)((long)pvVar8 + (long)iVar18 * 4);
        uVar13 = *puVar22;
        uVar14 = puVar22[1];
        puVar22 = (undefined8 *)((long)pvVar10 + (long)iVar18 * 4);
        local_370 = (float)uVar11;
        fStack_36c = (float)((ulong)uVar11 >> 0x20);
        fStack_368 = (float)uVar12;
        fStack_364 = (float)((ulong)uVar12 >> 0x20);
        local_380 = (float)uVar13;
        fStack_37c = (float)((ulong)uVar13 >> 0x20);
        fStack_378 = (float)uVar14;
        fStack_374 = (float)((ulong)uVar14 >> 0x20);
        *puVar22 = CONCAT44(fStack_36c * fStack_37c,local_370 * local_380);
        puVar22[1] = CONCAT44(fStack_364 * fStack_374,fStack_368 * fStack_378);
      }
      for (local_a74 = iVar28 * 4 + local_a74; local_a74 < iVar27; local_a74 = local_a74 + 1) {
        *(float *)((long)pvVar10 + (long)local_a74 * 4) =
             *(float *)((long)pvVar10 + (long)local_a74 * 4) *
             *(float *)((long)pvVar8 + (long)local_a74 * 4);
      }
    }
    else {
      for (local_930 = 0; local_930 < iVar27 / 8; local_930 = local_930 + 1) {
        iVar28 = local_930 * 8;
        puVar22 = (undefined8 *)((long)pvVar10 + (long)iVar28 * 4);
        puVar23 = (undefined8 *)((long)pvVar8 + (long)iVar28 * 4);
        puVar24 = (undefined8 *)(lVar9 + (long)iVar28 * 4);
        puVar25 = (undefined8 *)((long)pvVar10 + (long)iVar28 * 4);
        local_960 = (float)*puVar22;
        fStack_95c = (float)((ulong)*puVar22 >> 0x20);
        fStack_958 = (float)puVar22[1];
        fStack_954 = (float)((ulong)puVar22[1] >> 0x20);
        fStack_950 = (float)puVar22[2];
        fStack_94c = (float)((ulong)puVar22[2] >> 0x20);
        fStack_948 = (float)puVar22[3];
        fStack_944 = (float)((ulong)puVar22[3] >> 0x20);
        local_5a0 = (float)*puVar23;
        fStack_59c = (float)((ulong)*puVar23 >> 0x20);
        fStack_598 = (float)puVar23[1];
        fStack_594 = (float)((ulong)puVar23[1] >> 0x20);
        fStack_590 = (float)puVar23[2];
        fStack_58c = (float)((ulong)puVar23[2] >> 0x20);
        fStack_588 = (float)puVar23[3];
        local_1e0 = (float)*puVar24;
        fStack_1dc = (float)((ulong)*puVar24 >> 0x20);
        fStack_1d8 = (float)puVar24[1];
        fStack_1d4 = (float)((ulong)puVar24[1] >> 0x20);
        fStack_1d0 = (float)puVar24[2];
        fStack_1cc = (float)((ulong)puVar24[2] >> 0x20);
        fStack_1c8 = (float)puVar24[3];
        fStack_1c4 = (float)((ulong)puVar24[3] >> 0x20);
        *puVar25 = CONCAT44(fStack_95c * fStack_59c + fStack_1dc,local_960 * local_5a0 + local_1e0);
        puVar25[1] = CONCAT44(fStack_954 * fStack_594 + fStack_1d4,
                              fStack_958 * fStack_598 + fStack_1d8);
        puVar25[2] = CONCAT44(fStack_94c * fStack_58c + fStack_1cc,
                              fStack_950 * fStack_590 + fStack_1d0);
        puVar25[3] = CONCAT44(fStack_944 + fStack_1c4,fStack_948 * fStack_588 + fStack_1c8);
      }
      local_9e4 = (iVar27 / 8) * 8;
      iVar28 = (iVar27 % 8) / 4;
      for (local_9a4 = 0; local_9a4 < iVar28; local_9a4 = local_9a4 + 1) {
        iVar18 = local_9e4 + local_9a4 * 4;
        puVar22 = (undefined8 *)((long)pvVar10 + (long)iVar18 * 4);
        uVar11 = *puVar22;
        uVar12 = puVar22[1];
        puVar22 = (undefined8 *)((long)pvVar8 + (long)iVar18 * 4);
        uVar13 = *puVar22;
        uVar14 = puVar22[1];
        puVar22 = (undefined8 *)(lVar9 + (long)iVar18 * 4);
        uVar15 = *puVar22;
        uVar16 = puVar22[1];
        puVar22 = (undefined8 *)((long)pvVar10 + (long)iVar18 * 4);
        local_410 = (float)uVar11;
        fStack_40c = (float)((ulong)uVar11 >> 0x20);
        fStack_408 = (float)uVar12;
        fStack_404 = (float)((ulong)uVar12 >> 0x20);
        local_420 = (float)uVar13;
        fStack_41c = (float)((ulong)uVar13 >> 0x20);
        fStack_418 = (float)uVar14;
        fStack_414 = (float)((ulong)uVar14 >> 0x20);
        local_120 = (float)uVar15;
        fStack_11c = (float)((ulong)uVar15 >> 0x20);
        fStack_118 = (float)uVar16;
        fStack_114 = (float)((ulong)uVar16 >> 0x20);
        *puVar22 = CONCAT44(fStack_40c * fStack_41c + fStack_11c,local_410 * local_420 + local_120);
        puVar22[1] = CONCAT44(fStack_404 * fStack_414 + fStack_114,
                              fStack_408 * fStack_418 + fStack_118);
      }
      for (local_9e4 = iVar28 * 4 + local_9e4; local_9e4 < iVar27; local_9e4 = local_9e4 + 1) {
        *(float *)((long)pvVar10 + (long)local_9e4 * 4) =
             *(float *)((long)pvVar10 + (long)local_9e4 * 4) *
             *(float *)((long)pvVar8 + (long)local_9e4 * 4) +
             *(float *)(lVar9 + (long)local_9e4 * 4);
      }
    }
  }
  if (iVar6 == 2) {
    iVar27 = iVar19 * iVar7;
    for (local_a7c = 0; local_a7c < iVar3; local_a7c = local_a7c + 1) {
      local_a88 = (undefined1 (*) [24])
                  ((long)pvVar20->data + (long)pvVar20->w * (long)local_a7c * pvVar20->elemsize);
      fVar1 = *(float *)((long)pvVar8 + (long)local_a7c * 4);
      if (iVar7 == 4) {
        puVar22 = (undefined8 *)((long)pvVar8 + (long)(local_a7c << 2) * 4);
        local_d30 = *puVar22;
        uStack_d28 = puVar22[1];
      }
      else {
        local_d30 = CONCAT44(fVar1,fVar1);
        uStack_d28 = CONCAT44(fVar1,fVar1);
      }
      if (iVar7 == 8) {
        local_d60 = SUB3228(*(undefined1 (*) [32])((long)pvVar8 + (long)(local_a7c << 3) * 4),0);
      }
      else {
        auVar29._8_8_ = uStack_d28;
        auVar29._0_8_ = local_d30;
        auVar29._24_8_ = uStack_d28;
        auVar29._16_8_ = local_d30;
        local_d60 = auVar29._0_28_;
      }
      local_3a0 = (float)local_d30;
      fStack_39c = (float)((ulong)local_d30 >> 0x20);
      fStack_398 = (float)uStack_d28;
      fStack_394 = (float)((ulong)uStack_d28 >> 0x20);
      local_4a0 = local_d60._0_4_;
      fStack_49c = local_d60._4_4_;
      fStack_498 = local_d60._8_4_;
      fStack_494 = local_d60._12_4_;
      fStack_490 = local_d60._16_4_;
      fStack_48c = local_d60._20_4_;
      fStack_488 = local_d60._24_4_;
      if (*(int *)(in_RDI + 0xd4) == 0) {
        for (local_b54 = 0; local_b54 + 7 < iVar27; local_b54 = local_b54 + 8) {
          auVar17 = *local_a88;
          local_480 = auVar17._0_4_;
          fStack_47c = auVar17._4_4_;
          fStack_478 = auVar17._8_4_;
          fStack_474 = auVar17._12_4_;
          fStack_470 = auVar17._16_4_;
          fStack_46c = auVar17._20_4_;
          fStack_468 = (float)*(undefined8 *)local_a88[1];
          uStack_464 = (undefined4)((ulong)*(undefined8 *)local_a88[1] >> 0x20);
          *(ulong *)*local_a88 = CONCAT44(fStack_47c * fStack_49c,local_480 * local_4a0);
          *(ulong *)(*local_a88 + 8) = CONCAT44(fStack_474 * fStack_494,fStack_478 * fStack_498);
          *(ulong *)(*local_a88 + 0x10) = CONCAT44(fStack_46c * fStack_48c,fStack_470 * fStack_490);
          *(ulong *)local_a88[1] = CONCAT44(uStack_464,fStack_468 * fStack_488);
          local_a88 = (undefined1 (*) [24])(local_a88[1] + 8);
        }
        for (; local_b54 + 3 < iVar27; local_b54 = local_b54 + 4) {
          local_390 = (float)*(undefined8 *)*local_a88;
          fStack_38c = (float)((ulong)*(undefined8 *)*local_a88 >> 0x20);
          fStack_388 = (float)*(undefined8 *)(*local_a88 + 8);
          fStack_384 = (float)((ulong)*(undefined8 *)(*local_a88 + 8) >> 0x20);
          *(ulong *)*local_a88 = CONCAT44(fStack_38c * fStack_39c,local_390 * local_3a0);
          *(ulong *)(*local_a88 + 8) = CONCAT44(fStack_384 * fStack_394,fStack_388 * fStack_398);
          local_a88 = (undefined1 (*) [24])(*local_a88 + 0x10);
        }
        for (; local_b54 < iVar27; local_b54 = local_b54 + 1) {
          *(float *)*local_a88 = *(float *)*local_a88 * fVar1;
          local_a88 = (undefined1 (*) [24])(*local_a88 + 4);
        }
      }
      else {
        fVar2 = *(float *)(lVar9 + (long)local_a7c * 4);
        if (iVar7 == 4) {
          puVar22 = (undefined8 *)(lVar9 + (long)(local_a7c << 2) * 4);
          local_d70 = *puVar22;
          uStack_d68 = puVar22[1];
        }
        else {
          local_d70 = CONCAT44(fVar2,fVar2);
          uStack_d68 = CONCAT44(fVar2,fVar2);
        }
        if (iVar7 == 8) {
          local_da0 = *(undefined1 (*) [32])(lVar9 + (long)(local_a7c << 3) * 4);
        }
        else {
          local_da0._8_8_ = uStack_d68;
          local_da0._0_8_ = local_d70;
          local_da0._24_8_ = uStack_d68;
          local_da0._16_8_ = local_d70;
        }
        for (local_b04 = 0; local_b04 + 7 < iVar27; local_b04 = local_b04 + 8) {
          local_b40 = (float)*(undefined8 *)*local_a88;
          fStack_b3c = (float)((ulong)*(undefined8 *)*local_a88 >> 0x20);
          fStack_b38 = (float)*(undefined8 *)(*local_a88 + 8);
          fStack_b34 = (float)((ulong)*(undefined8 *)(*local_a88 + 8) >> 0x20);
          fStack_b30 = (float)*(undefined8 *)(*local_a88 + 0x10);
          fStack_b2c = (float)((ulong)*(undefined8 *)(*local_a88 + 0x10) >> 0x20);
          fStack_b28 = (float)*(undefined8 *)local_a88[1];
          fStack_b24 = (float)((ulong)*(undefined8 *)local_a88[1] >> 0x20);
          local_1a0 = local_da0._0_4_;
          fStack_19c = local_da0._4_4_;
          fStack_198 = local_da0._8_4_;
          fStack_194 = local_da0._12_4_;
          fStack_190 = local_da0._16_4_;
          fStack_18c = local_da0._20_4_;
          fStack_188 = local_da0._24_4_;
          fStack_184 = local_da0._28_4_;
          *(ulong *)*local_a88 =
               CONCAT44(fStack_b3c * fStack_49c + fStack_19c,local_b40 * local_4a0 + local_1a0);
          *(ulong *)(*local_a88 + 8) =
               CONCAT44(fStack_b34 * fStack_494 + fStack_194,fStack_b38 * fStack_498 + fStack_198);
          *(ulong *)(*local_a88 + 0x10) =
               CONCAT44(fStack_b2c * fStack_48c + fStack_18c,fStack_b30 * fStack_490 + fStack_190);
          *(ulong *)local_a88[1] =
               CONCAT44(fStack_b24 + fStack_184,fStack_b28 * fStack_488 + fStack_188);
          local_a88 = (undefined1 (*) [24])(local_a88[1] + 8);
        }
        for (; local_b04 + 3 < iVar27; local_b04 = local_b04 + 4) {
          local_3f0 = (float)*(undefined8 *)*local_a88;
          fStack_3ec = (float)((ulong)*(undefined8 *)*local_a88 >> 0x20);
          fStack_3e8 = (float)*(undefined8 *)(*local_a88 + 8);
          fStack_3e4 = (float)((ulong)*(undefined8 *)(*local_a88 + 8) >> 0x20);
          local_100 = (float)local_d70;
          fStack_fc = (float)((ulong)local_d70 >> 0x20);
          fStack_f8 = (float)uStack_d68;
          fStack_f4 = (float)((ulong)uStack_d68 >> 0x20);
          *(ulong *)*local_a88 =
               CONCAT44(fStack_3ec * fStack_39c + fStack_fc,local_3f0 * local_3a0 + local_100);
          *(ulong *)(*local_a88 + 8) =
               CONCAT44(fStack_3e4 * fStack_394 + fStack_f4,fStack_3e8 * fStack_398 + fStack_f8);
          local_a88 = (undefined1 (*) [24])(*local_a88 + 0x10);
        }
        for (; local_b04 < iVar27; local_b04 = local_b04 + 1) {
          *(float *)*local_a88 = *(float *)*local_a88 * fVar1 + fVar2;
          local_a88 = (undefined1 (*) [24])(*local_a88 + 4);
        }
      }
    }
  }
  if ((iVar6 == 3) || (iVar6 == 4)) {
    iVar19 = iVar19 * iVar3 * iVar4 * iVar7;
    for (local_b98 = 0; local_b98 < iVar5; local_b98 = local_b98 + 1) {
      local_ba0 = (undefined1 (*) [24])
                  ((long)pvVar20->data + pvVar20->cstep * (long)local_b98 * pvVar20->elemsize);
      fVar1 = *(float *)((long)pvVar8 + (long)local_b98 * 4);
      if (iVar7 == 4) {
        puVar22 = (undefined8 *)((long)pvVar8 + (long)(local_b98 << 2) * 4);
        local_de0 = *puVar22;
        uStack_dd8 = puVar22[1];
      }
      else {
        local_de0 = CONCAT44(fVar1,fVar1);
        uStack_dd8 = CONCAT44(fVar1,fVar1);
      }
      if (iVar7 == 8) {
        local_e00 = SUB3228(*(undefined1 (*) [32])((long)pvVar8 + (long)(local_b98 << 3) * 4),0);
      }
      else {
        auVar30._8_8_ = uStack_dd8;
        auVar30._0_8_ = local_de0;
        auVar30._24_8_ = uStack_dd8;
        auVar30._16_8_ = local_de0;
        local_e00 = auVar30._0_28_;
      }
      local_3c0 = (float)local_de0;
      fStack_3bc = (float)((ulong)local_de0 >> 0x20);
      fStack_3b8 = (float)uStack_dd8;
      fStack_3b4 = (float)((ulong)uStack_dd8 >> 0x20);
      local_4e0 = local_e00._0_4_;
      fStack_4dc = local_e00._4_4_;
      fStack_4d8 = local_e00._8_4_;
      fStack_4d4 = local_e00._12_4_;
      fStack_4d0 = local_e00._16_4_;
      fStack_4cc = local_e00._20_4_;
      fStack_4c8 = local_e00._24_4_;
      if (*(int *)(in_RDI + 0xd4) == 0) {
        for (local_cd4 = 0; local_cd4 + 7 < iVar19; local_cd4 = local_cd4 + 8) {
          auVar17 = *local_ba0;
          local_4c0 = auVar17._0_4_;
          fStack_4bc = auVar17._4_4_;
          fStack_4b8 = auVar17._8_4_;
          fStack_4b4 = auVar17._12_4_;
          fStack_4b0 = auVar17._16_4_;
          fStack_4ac = auVar17._20_4_;
          fStack_4a8 = (float)*(undefined8 *)local_ba0[1];
          uStack_4a4 = (undefined4)((ulong)*(undefined8 *)local_ba0[1] >> 0x20);
          *(ulong *)*local_ba0 = CONCAT44(fStack_4bc * fStack_4dc,local_4c0 * local_4e0);
          *(ulong *)(*local_ba0 + 8) = CONCAT44(fStack_4b4 * fStack_4d4,fStack_4b8 * fStack_4d8);
          *(ulong *)(*local_ba0 + 0x10) = CONCAT44(fStack_4ac * fStack_4cc,fStack_4b0 * fStack_4d0);
          *(ulong *)local_ba0[1] = CONCAT44(uStack_4a4,fStack_4a8 * fStack_4c8);
          local_ba0 = (undefined1 (*) [24])(local_ba0[1] + 8);
        }
        for (; local_cd4 + 3 < iVar19; local_cd4 = local_cd4 + 4) {
          local_3b0 = (float)*(undefined8 *)*local_ba0;
          fStack_3ac = (float)((ulong)*(undefined8 *)*local_ba0 >> 0x20);
          fStack_3a8 = (float)*(undefined8 *)(*local_ba0 + 8);
          fStack_3a4 = (float)((ulong)*(undefined8 *)(*local_ba0 + 8) >> 0x20);
          *(ulong *)*local_ba0 = CONCAT44(fStack_3ac * fStack_3bc,local_3b0 * local_3c0);
          *(ulong *)(*local_ba0 + 8) = CONCAT44(fStack_3a4 * fStack_3b4,fStack_3a8 * fStack_3b8);
          local_ba0 = (undefined1 (*) [24])(*local_ba0 + 0x10);
        }
        for (; local_cd4 < iVar19; local_cd4 = local_cd4 + 1) {
          *(float *)*local_ba0 = *(float *)*local_ba0 * fVar1;
          local_ba0 = (undefined1 (*) [24])(*local_ba0 + 4);
        }
      }
      else {
        fVar2 = *(float *)(lVar9 + (long)local_b98 * 4);
        if (iVar7 == 4) {
          puVar22 = (undefined8 *)(lVar9 + (long)(local_b98 << 2) * 4);
          local_e10 = *puVar22;
          uStack_e08 = puVar22[1];
        }
        else {
          local_e10 = CONCAT44(fVar2,fVar2);
          uStack_e08 = CONCAT44(fVar2,fVar2);
        }
        if (iVar7 == 8) {
          local_e40 = *(undefined1 (*) [32])(lVar9 + (long)(local_b98 << 3) * 4);
        }
        else {
          local_e40._8_8_ = uStack_e08;
          local_e40._0_8_ = local_e10;
          local_e40._24_8_ = uStack_e08;
          local_e40._16_8_ = local_e10;
        }
        for (local_c84 = 0; local_c84 + 7 < iVar19; local_c84 = local_c84 + 8) {
          local_cc0 = (float)*(undefined8 *)*local_ba0;
          fStack_cbc = (float)((ulong)*(undefined8 *)*local_ba0 >> 0x20);
          fStack_cb8 = (float)*(undefined8 *)(*local_ba0 + 8);
          fStack_cb4 = (float)((ulong)*(undefined8 *)(*local_ba0 + 8) >> 0x20);
          fStack_cb0 = (float)*(undefined8 *)(*local_ba0 + 0x10);
          fStack_cac = (float)((ulong)*(undefined8 *)(*local_ba0 + 0x10) >> 0x20);
          fStack_ca8 = (float)*(undefined8 *)local_ba0[1];
          fStack_ca4 = (float)((ulong)*(undefined8 *)local_ba0[1] >> 0x20);
          local_160 = local_e40._0_4_;
          fStack_15c = local_e40._4_4_;
          fStack_158 = local_e40._8_4_;
          fStack_154 = local_e40._12_4_;
          fStack_150 = local_e40._16_4_;
          fStack_14c = local_e40._20_4_;
          fStack_148 = local_e40._24_4_;
          fStack_144 = local_e40._28_4_;
          *(ulong *)*local_ba0 =
               CONCAT44(fStack_cbc * fStack_4dc + fStack_15c,local_cc0 * local_4e0 + local_160);
          *(ulong *)(*local_ba0 + 8) =
               CONCAT44(fStack_cb4 * fStack_4d4 + fStack_154,fStack_cb8 * fStack_4d8 + fStack_158);
          *(ulong *)(*local_ba0 + 0x10) =
               CONCAT44(fStack_cac * fStack_4cc + fStack_14c,fStack_cb0 * fStack_4d0 + fStack_150);
          *(ulong *)local_ba0[1] =
               CONCAT44(fStack_ca4 + fStack_144,fStack_ca8 * fStack_4c8 + fStack_148);
          local_ba0 = (undefined1 (*) [24])(local_ba0[1] + 8);
        }
        for (; local_c84 + 3 < iVar19; local_c84 = local_c84 + 4) {
          local_3d0 = (float)*(undefined8 *)*local_ba0;
          fStack_3cc = (float)((ulong)*(undefined8 *)*local_ba0 >> 0x20);
          fStack_3c8 = (float)*(undefined8 *)(*local_ba0 + 8);
          fStack_3c4 = (float)((ulong)*(undefined8 *)(*local_ba0 + 8) >> 0x20);
          local_e0 = (float)local_e10;
          fStack_dc = (float)((ulong)local_e10 >> 0x20);
          fStack_d8 = (float)uStack_e08;
          fStack_d4 = (float)((ulong)uStack_e08 >> 0x20);
          *(ulong *)*local_ba0 =
               CONCAT44(fStack_3cc * fStack_3bc + fStack_dc,local_3d0 * local_3c0 + local_e0);
          *(ulong *)(*local_ba0 + 8) =
               CONCAT44(fStack_3c4 * fStack_3b4 + fStack_d4,fStack_3c8 * fStack_3b8 + fStack_d8);
          local_ba0 = (undefined1 (*) [24])(*local_ba0 + 0x10);
        }
        for (; local_c84 < iVar19; local_c84 = local_c84 + 1) {
          *(float *)*local_ba0 = *(float *)*local_ba0 * fVar1 + fVar2;
          local_ba0 = (undefined1 (*) [24])(*local_ba0 + 4);
        }
      }
    }
  }
  return 0;
}

Assistant:

int Scale_x86_avx::forward_inplace(std::vector<Mat>& bottom_top_blobs, const Option& opt) const
{
    Mat& bottom_top_blob = bottom_top_blobs[0];
    const Mat& scale_blob = bottom_top_blobs[1];

    const int w = bottom_top_blob.w;
    const int h = bottom_top_blob.h;
    const int d = bottom_top_blob.d;
    const int channels = bottom_top_blob.c;
    const int dims = bottom_top_blob.dims;

    const int elempack = bottom_top_blob.elempack;

    const float* scale = scale_blob;
    const float* bias = bias_data;

    if (dims == 1)
    {
        float* ptr = (float*)bottom_top_blob;
        const int size = w * elempack;

        if (bias_term)
        {
            int nn_size = 0;
            int remain_size_start = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
            nn_size = (size - remain_size_start) / 16;
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int ii = 0; ii < nn_size; ii++)
            {
                int i = remain_size_start + ii * 16;
                __m512 _p512 = _mm512_loadu_ps(ptr + i);
                __m512 _s512 = _mm512_loadu_ps(scale + i);
                __m512 _bias512 = _mm512_loadu_ps(bias + i);
                _mm512_storeu_ps(ptr + i, _mm512_fmadd_ps(_p512, _s512, _bias512));
            }
            remain_size_start += nn_size * 16;
#endif // __AVX512F__
            nn_size = (size - remain_size_start) / 8;
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int ii = 0; ii < nn_size; ii++)
            {
                int i = remain_size_start + ii * 8;
                __m256 _p256 = _mm256_loadu_ps(ptr + i);
                __m256 _s256 = _mm256_loadu_ps(scale + i);
                __m256 _bias256 = _mm256_loadu_ps(bias + i);
                _mm256_storeu_ps(ptr + i, _mm256_comp_fmadd_ps(_p256, _s256, _bias256));
            }
            remain_size_start += nn_size * 8;
#endif // __AVX__
            nn_size = (size - remain_size_start) / 4;
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int ii = 0; ii < nn_size; ii++)
            {
                int i = remain_size_start + ii * 4;
                __m128 _p128 = _mm_load_ps(ptr + i);
                __m128 _s128 = _mm_load_ps(scale + i);
                __m128 _bias128 = _mm_loadu_ps(bias + i);
                _mm_store_ps(ptr + i, _mm_comp_fmadd_ps(_p128, _s128, _bias128));
            }
            remain_size_start += nn_size * 4;
#endif // __SSE2__
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i = remain_size_start; i < size; i++)
            {
                ptr[i] = ptr[i] * scale[i] + bias[i];
            }
        }
        else
        {
            int nn_size = 0;
            int remain_size_start = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
            nn_size = (size - remain_size_start) / 16;
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int ii = 0; ii < nn_size; ii++)
            {
                int i = remain_size_start + ii * 16;
                __m512 _p512 = _mm512_loadu_ps(ptr + i);
                __m512 _s512 = _mm512_loadu_ps(scale + i);
                _mm512_storeu_ps(ptr + i, _mm512_mul_ps(_p512, _s512));
            }
            remain_size_start += nn_size * 16;
#endif // __AVX512F__
            nn_size = (size - remain_size_start) / 8;
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int ii = 0; ii < nn_size; ii++)
            {
                int i = remain_size_start + ii * 8;
                __m256 _p256 = _mm256_loadu_ps(ptr + i);
                __m256 _s256 = _mm256_loadu_ps(scale + i);
                _mm256_storeu_ps(ptr + i, _mm256_mul_ps(_p256, _s256));
            }
            remain_size_start += nn_size * 8;
#endif // __AVX__
            nn_size = (size - remain_size_start) / 4;
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int ii = 0; ii < nn_size; ii++)
            {
                int i = remain_size_start + ii * 4;
                __m128 _p128 = _mm_load_ps(ptr + i);
                __m128 _s128 = _mm_load_ps(scale + i);
                _mm_store_ps(ptr + i, _mm_mul_ps(_p128, _s128));
            }
            remain_size_start += nn_size * 4;
#endif // __SSE2__
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i = remain_size_start; i < size; i++)
            {
                ptr[i] = ptr[i] * scale[i];
            }
        }
    }

    if (dims == 2)
    {
        const int size = w * elempack;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int i = 0; i < h; i++)
        {
            float* ptr = bottom_top_blob.row(i);

            float s = scale[i];
#if __SSE2__
            __m128 _s128 = (elempack == 4) ? _mm_loadu_ps(scale + i * 4) : _mm_set1_ps(s);
#if __AVX__
            __m256 _s256 = (elempack == 8) ? _mm256_loadu_ps(scale + i * 8) : _mm256_insertf128_ps(_mm256_castps128_ps256(_s128), _s128, 1);
#if __AVX512F__
            __m512 _s512 = (elempack == 16) ? _mm512_loadu_ps(scale + i * 16) : _mm512_insertf32x8(_mm512_castps256_ps512(_s256), _s256, 1);
#endif // __AVX512F__
#endif // __AVX__
#endif // __SSE2__

            if (bias_term)
            {
                float b = bias[i];
#if __SSE2__
                __m128 _b128 = (elempack == 4) ? _mm_loadu_ps(bias + i * 4) : _mm_set1_ps(b);
#if __AVX__
                __m256 _b256 = (elempack == 8) ? _mm256_loadu_ps(bias + i * 8) : _mm256_insertf128_ps(_mm256_castps128_ps256(_b128), _b128, 1);
#if __AVX512F__
                __m512 _b512 = (elempack == 16) ? _mm512_loadu_ps(bias + i * 16) : _mm512_insertf32x8(_mm512_castps256_ps512(_b256), _b256, 1);
#endif // __AVX512F__
#endif // __AVX__
#endif // __SSE2__

                int j = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
                for (; j + 15 < size; j += 16)
                {
                    __m512 _p512 = _mm512_loadu_ps(ptr);
                    _mm512_storeu_ps(ptr, _mm512_fmadd_ps(_p512, _s512, _b512));
                    ptr += 16;
                }
#endif // __AVX512F__
                for (; j + 7 < size; j += 8)
                {
                    __m256 _p256 = _mm256_loadu_ps(ptr);
                    _mm256_storeu_ps(ptr, _mm256_comp_fmadd_ps(_p256, _s256, _b256));
                    ptr += 8;
                }
#endif // __AVX__
                for (; j + 3 < size; j += 4)
                {
                    __m128 _p128 = _mm_loadu_ps(ptr);
                    _mm_storeu_ps(ptr, _mm_comp_fmadd_ps(_p128, _s128, _b128));
                    ptr += 4;
                }
#endif // __SSE__
                for (; j < size; j++)
                {
                    *ptr = *ptr * s + b;
                    ptr++;
                }
            }
            else
            {
                int j = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
                for (; j + 15 < size; j += 16)
                {
                    __m512 _p512 = _mm512_loadu_ps(ptr);
                    _mm512_storeu_ps(ptr, _mm512_mul_ps(_p512, _s512));
                    ptr += 16;
                }
#endif // __AVX512F__
                for (; j + 7 < size; j += 8)
                {
                    __m256 _p256 = _mm256_loadu_ps(ptr);
                    _mm256_storeu_ps(ptr, _mm256_mul_ps(_p256, _s256));
                    ptr += 8;
                }
#endif // __AVX__
                for (; j + 3 < size; j += 4)
                {
                    __m128 _p128 = _mm_loadu_ps(ptr);
                    _mm_storeu_ps(ptr, _mm_mul_ps(_p128, _s128));
                    ptr += 4;
                }
#endif // __SSE__
                for (; j < size; j++)
                {
                    *ptr = *ptr * s;
                    ptr++;
                }
            }
        }
    }

    if (dims == 3 || dims == 4)
    {
        const int size = w * h * d * elempack;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            float* ptr = bottom_top_blob.channel(q);

            float s = scale[q];
#if __SSE2__
            __m128 _s128 = (elempack == 4) ? _mm_loadu_ps(scale + q * 4) : _mm_set1_ps(s);
#if __AVX__
            __m256 _s256 = (elempack == 8) ? _mm256_loadu_ps(scale + q * 8) : _mm256_insertf128_ps(_mm256_castps128_ps256(_s128), _s128, 1);
#if __AVX512F__
            __m512 _s512 = (elempack == 16) ? _mm512_loadu_ps(scale + q * 16) : _mm512_insertf32x8(_mm512_castps256_ps512(_s256), _s256, 1);
#endif // __AVX512F__
#endif // __AVX__
#endif // __SSE2__

            if (bias_term)
            {
                float b = bias[q];
#if __SSE2__
                __m128 _b128 = (elempack == 4) ? _mm_loadu_ps(bias + q * 4) : _mm_set1_ps(b);
#if __AVX__
                __m256 _b256 = (elempack == 8) ? _mm256_loadu_ps(bias + q * 8) : _mm256_insertf128_ps(_mm256_castps128_ps256(_b128), _b128, 1);
#if __AVX512F__
                __m512 _b512 = (elempack == 16) ? _mm512_loadu_ps(bias + q * 16) : _mm512_insertf32x8(_mm512_castps256_ps512(_b256), _b256, 1);
#endif // __AVX512F__
#endif // __AVX__
#endif // __SSE2__

                int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
                for (; i + 15 < size; i += 16)
                {
                    __m512 _p512 = _mm512_loadu_ps(ptr);
                    _mm512_storeu_ps(ptr, _mm512_fmadd_ps(_p512, _s512, _b512));
                    ptr += 16;
                }
#endif // __AVX512F__
                for (; i + 7 < size; i += 8)
                {
                    __m256 _p256 = _mm256_loadu_ps(ptr);
                    _mm256_storeu_ps(ptr, _mm256_comp_fmadd_ps(_p256, _s256, _b256));
                    ptr += 8;
                }
#endif // __AVX__
                for (; i + 3 < size; i += 4)
                {
                    __m128 _p128 = _mm_loadu_ps(ptr);
                    _mm_storeu_ps(ptr, _mm_comp_fmadd_ps(_p128, _s128, _b128));
                    ptr += 4;
                }
#endif // __SSE__
                for (; i < size; i++)
                {
                    *ptr = *ptr * s + b;
                    ptr++;
                }
            }
            else
            {
                int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
                for (; i + 15 < size; i += 16)
                {
                    __m512 _p512 = _mm512_loadu_ps(ptr);
                    _mm512_storeu_ps(ptr, _mm512_mul_ps(_p512, _s512));
                    ptr += 16;
                }
#endif // __AVX512F__
                for (; i + 7 < size; i += 8)
                {
                    __m256 _p256 = _mm256_loadu_ps(ptr);
                    _mm256_storeu_ps(ptr, _mm256_mul_ps(_p256, _s256));
                    ptr += 8;
                }
#endif // __AVX__
                for (; i + 3 < size; i += 4)
                {
                    __m128 _p128 = _mm_loadu_ps(ptr);
                    _mm_storeu_ps(ptr, _mm_mul_ps(_p128, _s128));
                    ptr += 4;
                }
#endif // __SSE__
                for (; i < size; i++)
                {
                    *ptr = *ptr * s;
                    ptr++;
                }
            }
        }
    }

    return 0;
}